

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

optional<LockPoints> *
CalculateLockPointsAtTip
          (optional<LockPoints> *__return_storage_ptr__,CBlockIndex *tip,CCoinsView *coins_view,
          CTransaction *tx)

{
  int iVar1;
  long lVar2;
  pointer pCVar3;
  CBlockIndex *pCVar4;
  string_view source_file;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Logger *pLVar9;
  undefined8 uVar10;
  CBlockIndex **ppCVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar13;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  pair<int,_long> pVar14;
  ulong local_1e0;
  vector<int,_std::allocator<int>_> prev_heights;
  _Storage<std::vector<int,_std::allocator<int>_>,_false> local_1b8;
  char local_1a0;
  CBlockIndex next_tip;
  string local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xcd,
                  "std::optional<LockPoints> CalculateLockPointsAtTip(CBlockIndex *, const CCoinsView &, const CTransaction &)"
                 );
  }
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            (&prev_heights,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68);
  uVar13 = 0;
  while( true ) {
    pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar3) / 0x68;
    local_1e0 = uVar13;
    if (uVar8 <= uVar13) break;
    Coin::Coin((Coin *)&next_tip);
    iVar6 = (**coins_view->_vptr_CCoinsView)(coins_view,pCVar3 + uVar13,&next_tip);
    if ((char)iVar6 == '\0') {
      base_blob<256u>::GetHex_abi_cxx11_(local_f8,(base_blob<256u> *)&tx->hash);
      pLVar9 = LogInstance();
      bVar5 = BCLog::Logger::Enabled(pLVar9);
      if (bVar5) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[21],unsigned_long,std::__cxx11::string>
                  (&local_78,(tinyformat *)"ERROR: %s: Missing input %d in transaction \'%s\'\n",
                   "CalculatePrevHeights",(char (*) [21])&local_1e0,(unsigned_long *)local_f8,in_R9)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar9 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0xce5cd9;
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xba;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "CalculatePrevHeights";
        logging_function._M_len = 0x14;
        BCLog::Logger::LogPrintStr(pLVar9,str,logging_function,source_file,0xba,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)local_f8);
      local_1a0 = '\0';
    }
    else {
      uVar7 = next_tip.nChainWork.super_base_uint<256U>.pn[0] >> 1;
      if (uVar7 == 0x7fffffff) {
        uVar7 = tip->nHeight + 1;
      }
      prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_1e0] = uVar7;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&next_tip.pprev);
    if ((char)iVar6 == '\0') goto LAB_008b3437;
    uVar13 = local_1e0 + 1;
  }
  local_1b8._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1b8._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1b8._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a0 = '\x01';
LAB_008b3437:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prev_heights.super__Vector_base<int,_std::allocator<int>_>);
  if (uVar13 < uVar8) {
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = false;
  }
  else {
    CBlockIndex::CBlockIndex(&next_tip);
    next_tip.nHeight = tip->nHeight + 1;
    next_tip.pprev = tip;
    if (local_1a0 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_008b36ba;
    }
    pVar14 = CalculateSequenceLocks(tx,1,&local_1b8._M_value,&next_tip);
    if (local_1a0 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_008b36ba;
    }
    iVar6 = 0;
    for (uVar10 = local_1b8._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (pointer)uVar10 !=
        local_1b8._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish; uVar10 = uVar10 + 4) {
      iVar1 = *(int *)uVar10;
      iVar12 = iVar1;
      if (iVar1 < iVar6) {
        iVar12 = iVar6;
      }
      if (iVar1 != next_tip.nHeight) {
        iVar6 = iVar12;
      }
    }
    log_msg._M_dataplus._M_p = (pointer)CBlockIndex::GetAncestor(tip,iVar6);
    ppCVar11 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)&log_msg,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0xf2,"CalculateLockPointsAtTip","tip->GetAncestor(max_input_height)");
    pCVar4 = *ppCVar11;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.height = pVar14.first;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.time = pVar14.second;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.maxInputBlock = pCVar4;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = true;
  }
  std::_Optional_payload_base<std::vector<int,_std::allocator<int>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<int,_std::allocator<int>_>_> *)&local_1b8._M_value)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
LAB_008b36ba:
  __stack_chk_fail();
}

Assistant:

std::optional<LockPoints> CalculateLockPointsAtTip(
    CBlockIndex* tip,
    const CCoinsView& coins_view,
    const CTransaction& tx)
{
    assert(tip);

    auto prev_heights{CalculatePrevHeights(*tip, coins_view, tx)};
    if (!prev_heights.has_value()) return std::nullopt;

    CBlockIndex next_tip;
    next_tip.pprev = tip;
    // When SequenceLocks() is called within ConnectBlock(), the height
    // of the block *being* evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    next_tip.nHeight = tip->nHeight + 1;
    const auto [min_height, min_time] = CalculateSequenceLocks(tx, STANDARD_LOCKTIME_VERIFY_FLAGS, prev_heights.value(), next_tip);

    // Also store the hash of the block with the highest height of
    // all the blocks which have sequence locked prevouts.
    // This hash needs to still be on the chain
    // for these LockPoint calculations to be valid
    // Note: It is impossible to correctly calculate a maxInputBlock
    // if any of the sequence locked inputs depend on unconfirmed txs,
    // except in the special case where the relative lock time/height
    // is 0, which is equivalent to no sequence lock. Since we assume
    // input height of tip+1 for mempool txs and test the resulting
    // min_height and min_time from CalculateSequenceLocks against tip+1.
    int max_input_height{0};
    for (const int height : prev_heights.value()) {
        // Can ignore mempool inputs since we'll fail if they had non-zero locks
        if (height != next_tip.nHeight) {
            max_input_height = std::max(max_input_height, height);
        }
    }

    // tip->GetAncestor(max_input_height) should never return a nullptr
    // because max_input_height is always less than the tip height.
    // It would, however, be a bad bug to continue execution, since a
    // LockPoints object with the maxInputBlock member set to nullptr
    // signifies no relative lock time.
    return LockPoints{min_height, min_time, Assert(tip->GetAncestor(max_input_height))};
}